

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

void __thiscall t_st_generator::generate_const(t_st_generator *this,t_const *tconst)

{
  t_type *type;
  pointer pcVar1;
  t_const_value *value;
  ostream *poVar2;
  string name;
  char *local_a8;
  long local_a0;
  char local_98 [16];
  string local_88;
  string local_68;
  string local_48;
  
  type = tconst->type_;
  pcVar1 = (tconst->name_)._M_dataplus._M_p;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + (tconst->name_)._M_string_length);
  value = tconst->value_;
  class_name_abi_cxx11_(&local_48,this);
  prefix(&local_68,this,&local_48);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," constants at: \'",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_a8,local_a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' put: [",8);
  render_const_value_abi_cxx11_(&local_88,this,type,value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]!",2);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void t_st_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  f_ << prefix(class_name()) << " constants at: '" << name << "' put: ["
     << render_const_value(type, value) << "]!" << endl << endl;
}